

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O0

bool google::protobuf::json_internal::Proto3Type::IsMap(Field f)

{
  Field_Kind FVar1;
  Field *this;
  Status local_28;
  byte local_19;
  Field pFStack_18;
  bool value;
  Field f_local;
  
  pFStack_18 = f;
  this = ResolverPool::Field::proto(f);
  FVar1 = Field::kind(this);
  if (FVar1 == Field_Kind_TYPE_MESSAGE) {
    local_19 = 0;
    WithFieldType<google::protobuf::json_internal::Proto3Type::IsMap(google::protobuf::json_internal::ResolverPool::Field_const*)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&)_1_>
              ((Proto3Type *)&local_28,pFStack_18,(anon_class_8_1_a8c68091)&local_19);
    absl::lts_20240722::Status::~Status(&local_28);
    f_local._7_1_ = (bool)(local_19 & 1);
  }
  else {
    f_local._7_1_ = false;
  }
  return f_local._7_1_;
}

Assistant:

static bool IsMap(Field f) {
    if (f->proto().kind() != google::protobuf::Field::TYPE_MESSAGE) {
      return false;
    }

    bool value = false;
    (void)WithFieldType(f, [&value](const Desc& desc) {
      value = absl::c_any_of(desc.proto().options(), [&](auto& option) {
        return option.name() == "map_entry";
      });
      return absl::OkStatus();
    });
    return value;
  }